

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  uv__work *ptr;
  uv__queue *puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  uv_dirent_type_t uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint *puVar11;
  ssize_t sVar12;
  ulong uVar13;
  size_t sVar14;
  dirent64 *dent;
  char *pcVar15;
  _func_void_uv__work_ptr *p_Var16;
  DIR *pDVar17;
  size_t sVar18;
  ssize_t sVar19;
  _func_void_uv__work_ptr *p_Var20;
  uint uVar21;
  long lVar22;
  _func_void_uv__work_ptr_int *p_Var23;
  iovec *piVar24;
  void *__buf;
  code *pcVar25;
  uv__queue *puVar26;
  uv__queue *puVar27;
  long lVar28;
  size_t sVar29;
  uv__queue *puStackY_21b0;
  uint local_2194;
  _func_void_uv__work_ptr_int *local_2190;
  stat64 local_2158;
  pollfd pfd;
  __ino64_t local_20c0;
  __mode_t local_20b0;
  size_t local_2098;
  statfs s;
  
  iVar1 = *(int *)&w[-7].done;
  puVar11 = (uint *)__errno_location();
  buf = &w[-6].loop;
  do {
    *puVar11 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      iVar6 = open64((char *)w[-6].done,*(uint *)((long)&w[-2].wq.next + 4) | 0x80000,
                     (ulong)*(uint *)&w[-2].wq.prev);
      break;
    case 2:
      iVar6 = uv__close_nocancel(*(int *)&w[-2].wq.next);
      if (iVar6 == -1) {
        iVar6 = -(uint)(*puVar11 != 0x73 && *puVar11 != 4);
      }
      break;
    case 3:
      uVar10 = uv__getiovmax();
      uVar8 = *(uint *)((long)&w[-2].wq.prev + 4);
      if (uVar10 < uVar8) {
        *(uint *)((long)&w[-2].wq.prev + 4) = uVar10;
        uVar8 = uVar10;
      }
      p_Var23 = w[-1].done;
      if ((long)p_Var23 < 0) {
        iVar6 = *(int *)&w[-2].wq.next;
        piVar24 = (iovec *)w[-1].work;
        if (uVar8 == 1) {
          puStackY_21b0 = (uv__queue *)read(iVar6,piVar24->iov_base,piVar24->iov_len);
        }
        else {
          puStackY_21b0 = (uv__queue *)readv(iVar6,piVar24,uVar8);
        }
      }
      else if (uVar8 == 1) {
        puStackY_21b0 =
             (uv__queue *)
             pread64(*(int *)&w[-2].wq.next,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                     (__off64_t)p_Var23);
      }
      else if (uv__fs_read_no_preadv == 0) {
        puStackY_21b0 =
             (uv__queue *)
             preadv64(*(int *)&w[-2].wq.next,(iovec *)w[-1].work,uVar8,(__off64_t)p_Var23);
        if (puStackY_21b0 == (uv__queue *)0xffffffffffffffff) {
          if (*puVar11 == 0x26) {
            uv__fs_read_no_preadv = 1;
            uVar8 = *(uint *)((long)&w[-2].wq.prev + 4);
            p_Var23 = w[-1].done;
            goto LAB_00161898;
          }
          puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
        }
      }
      else {
LAB_00161898:
        if (uVar8 == 0) {
          __assert_fail("nbufs > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/third-party/libuv-1.46.0/src/unix/fs.c"
                        ,0x1a8,"ssize_t uv__fs_preadv(uv_file, uv_buf_t *, unsigned int, off_t)");
        }
        iVar6 = *(int *)&w[-2].wq.next;
        p_Var16 = w[-1].work;
        p_Var20 = p_Var16 + (ulong)uVar8 * 0x10;
        puStackY_21b0 = (uv__queue *)0x0;
        do {
          uVar13 = 0;
          do {
            while (sVar12 = pread64(iVar6,(void *)(*(long *)p_Var16 + uVar13),
                                    *(long *)(p_Var16 + 8) - uVar13,
                                    (__off64_t)(p_Var23 + (long)&puStackY_21b0->next)), sVar12 == -1
                  ) {
              if ((long)(int)*puVar11 != 4) {
                if (puStackY_21b0 == (uv__queue *)0x0) {
                  puStackY_21b0 = (uv__queue *)-(long)(int)*puVar11;
                }
                goto LAB_00161aa5;
              }
            }
            if (sVar12 == 0) goto LAB_00161aa5;
            uVar13 = uVar13 + sVar12;
            puStackY_21b0 = (uv__queue *)((long)&puStackY_21b0->next + sVar12);
          } while (uVar13 < *(ulong *)(p_Var16 + 8));
          p_Var16 = p_Var16 + 0x10;
        } while (p_Var16 != p_Var20);
      }
LAB_00161aa5:
      ptr = (uv__work *)w[-1].work;
      puVar27 = puStackY_21b0;
joined_r0x00161cef:
      puStackY_21b0 = puVar27;
      if (ptr != w + 1) {
        uv__free(ptr);
      }
      w[-1].work = (_func_void_uv__work_ptr *)0x0;
      *(undefined4 *)((long)&w[-2].wq.prev + 4) = 0;
      goto LAB_0016176e;
    case 4:
      uVar10 = uv__getiovmax();
      uVar8 = *(uint *)((long)&w[-2].wq.prev + 4);
      ptr = (uv__work *)w[-1].work;
      puVar27 = (uv__queue *)0x0;
LAB_001611e2:
      if (uVar8 != 0) {
        uVar21 = uVar10;
        if (uVar8 < uVar10) {
          uVar21 = uVar8;
        }
        *(uint *)((long)&w[-2].wq.prev + 4) = uVar21;
        do {
          p_Var23 = w[-1].done;
          if ((long)p_Var23 < 0) {
            iVar6 = *(int *)&w[-2].wq.next;
            piVar24 = (iovec *)w[-1].work;
            if (uVar21 == 1) {
              puStackY_21b0 = (uv__queue *)write(iVar6,piVar24->iov_base,piVar24->iov_len);
            }
            else {
              puStackY_21b0 = (uv__queue *)writev(iVar6,piVar24,uVar21);
            }
LAB_00161269:
            if (-1 < (long)puStackY_21b0) goto LAB_001612ab;
            uVar21 = *puVar11;
          }
          else {
            if (uVar21 == 1) {
              iVar6 = *(int *)&w[-2].wq.next;
              __buf = *(void **)w[-1].work;
              sVar18 = *(size_t *)(w[-1].work + 8);
LAB_0016124d:
              puStackY_21b0 = (uv__queue *)pwrite64(iVar6,__buf,sVar18,(__off64_t)p_Var23);
              goto LAB_00161269;
            }
            piVar24 = (iovec *)w[-1].work;
            if (uv__fs_write_no_pwritev != 0) {
LAB_00161240:
              iVar6 = *(int *)&w[-2].wq.next;
              __buf = piVar24->iov_base;
              sVar18 = piVar24->iov_len;
              goto LAB_0016124d;
            }
            puStackY_21b0 =
                 (uv__queue *)pwritev64(*(int *)&w[-2].wq.next,piVar24,uVar21,(__off64_t)p_Var23);
            if (puStackY_21b0 != (uv__queue *)0xffffffffffffffff) goto LAB_00161269;
            uVar21 = *puVar11;
            if (uVar21 == 0x26) {
              uv__fs_write_no_pwritev = 1;
              piVar24 = (iovec *)w[-1].work;
              p_Var23 = w[-1].done;
              goto LAB_00161240;
            }
            puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
          }
          if (uVar21 != 4) goto LAB_00161cde;
          uVar21 = *(uint *)((long)&w[-2].wq.prev + 4);
        } while( true );
      }
      goto joined_r0x00161cef;
    case 5:
      iVar6 = *(int *)&w[-2].wq.next;
      iVar9 = *(int *)((long)&w[-2].wq.next + 4);
      local_2158.st_dev = (__dev_t)w[-1].done;
      p_Var23 = w[1].done;
      if (uv__fs_try_copy_file_range_no_copy_file_range_support != 0) goto LAB_00160ec7;
      sVar19 = uv__fs_copy_file_range
                         (iVar9,(off_t_conflict *)&local_2158,iVar6,(off_t_conflict *)0x0,
                          (size_t)p_Var23,0);
      if (sVar19 == -1) {
        uVar8 = *puVar11;
        if (uVar8 == 1) {
          iVar5 = uv__is_cifs_or_smb(iVar6);
          if (iVar5 == 0) goto LAB_00161d28;
LAB_00160ec7:
          *puVar11 = 0x26;
LAB_00160ed2:
          sVar12 = sendfile64(iVar6,iVar9,(__off64_t *)&local_2158,(size_t)p_Var23);
          if (sVar12 != -1) goto LAB_00161806;
        }
        else {
          if ((uVar8 == 0x5f) || (uVar8 == 0x12)) goto LAB_00160ec7;
          if (uVar8 == 0x26) {
            uv__fs_try_copy_file_range_no_copy_file_range_support = 1;
LAB_00161d28:
            uVar8 = *puVar11;
          }
          else if (uVar8 == 0xd) {
            iVar5 = fstatfs64(iVar9,(statfs64 *)&s);
            if (((iVar5 != -1) && (s.f_type == 0xc36400)) &&
               (uVar8 = uv__kernel_version(), uVar8 < 0x41400)) goto LAB_00160ec7;
            goto LAB_00161d28;
          }
          if (uVar8 == 0x26) goto LAB_00160ed2;
        }
        if ((long)local_2158.st_dev <= (long)w[-1].done) {
          uVar8 = *puVar11;
          if (((uVar8 < 0x17) && ((0x440020U >> (uVar8 & 0x1f) & 1) != 0)) || (uVar8 == 0x58)) {
            bVar3 = true;
            *puVar11 = 0;
            puVar27 = (uv__queue *)w[1].done;
            iVar6 = *(int *)&w[-2].wq.next;
            iVar9 = *(int *)((long)&w[-2].wq.next + 4);
            local_2190 = w[-1].done;
            puStackY_21b0 = (uv__queue *)0x0;
LAB_00160f49:
            for (; uVar13 = (long)puVar27 - (long)puStackY_21b0,
                puStackY_21b0 <= puVar27 && uVar13 != 0;
                puStackY_21b0 = (uv__queue *)((long)&puStackY_21b0->next + lVar28)) {
              sVar18 = 0x2000;
              if (uVar13 < 0x2000) {
                sVar18 = uVar13;
              }
              while( true ) {
                if (bVar3) {
                  lVar28 = pread64(iVar9,&s,sVar18,(__off64_t)local_2190);
                }
                else {
                  lVar28 = read(iVar9,&s,sVar18);
                }
                if (lVar28 != -1) break;
                uVar8 = *puVar11;
                if (uVar8 != 4) goto code_r0x00160fa2;
              }
              if (lVar28 == 0) break;
              for (lVar22 = 0; lVar28 - lVar22 != 0 && lVar22 <= lVar28; lVar22 = lVar22 + sVar12) {
                while (sVar12 = write(iVar6,(void *)((long)&((statfs *)(&s.f_fsid + -7))->f_type +
                                                    lVar22),lVar28 - lVar22), sVar12 == -1) {
                  if (*puVar11 != 4) {
                    if (*puVar11 != 0xb) {
                      puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
                      goto LAB_0016176e;
                    }
                    pfd.events = 4;
                    pfd.revents = 0;
                    pfd.fd = iVar6;
                    while (iVar5 = poll((pollfd *)&pfd,1,-1), iVar5 == -1) {
                      if (*puVar11 != 4) goto LAB_00161ca0;
                    }
                    if ((pfd.revents & 0xfffbU) != 0) {
LAB_00161ca0:
                      *puVar11 = 5;
                      goto LAB_00161cac;
                    }
                  }
                }
              }
              local_2190 = local_2190 + lVar28;
            }
            if (puStackY_21b0 != (uv__queue *)0xffffffffffffffff) goto LAB_00161c86;
            goto LAB_00161dcc;
          }
LAB_00161cac:
          puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
          goto LAB_0016176e;
        }
      }
LAB_00161806:
      puStackY_21b0 = (uv__queue *)(local_2158.st_dev + -(long)w[-1].done);
      w[-1].done = (_func_void_uv__work_ptr_int *)local_2158.st_dev;
      goto LAB_0016176e;
    case 6:
      p_Var23 = w[-6].done;
      iVar6 = uv__fs_statx(-1,(char *)p_Var23,0,0,(uv_stat_t *)buf);
      if (iVar6 == -0x26) {
        iVar6 = stat64((char *)p_Var23,(stat64 *)&s);
LAB_001615a4:
        if (iVar6 == 0) {
          uv__to_stat((stat *)&s,(uv_stat_t *)buf);
          iVar6 = 0;
        }
      }
      break;
    case 7:
      p_Var23 = w[-6].done;
      iVar6 = uv__fs_statx(-1,(char *)p_Var23,0,1,(uv_stat_t *)buf);
      if (iVar6 == -0x26) {
        iVar6 = lstat64((char *)p_Var23,(stat64 *)&s);
        goto LAB_001615a4;
      }
      break;
    case 8:
      iVar9 = *(int *)&w[-2].wq.next;
      iVar6 = uv__fs_statx(iVar9,"",1,0,(uv_stat_t *)buf);
      if ((iVar6 == -0x26) && (iVar6 = fstat64(iVar9,(stat64 *)&s), iVar6 == 0)) {
        uv__to_stat((stat *)&s,(uv_stat_t *)buf);
        iVar6 = 0;
      }
      break;
    case 9:
      iVar6 = ftruncate64(*(int *)&w[-2].wq.next,(__off64_t)w[-1].done);
      break;
    case 10:
      s._0_16_ = uv__fs_to_timespec((double)w[-1].wq.next);
      s._16_16_ = uv__fs_to_timespec((double)w[-1].wq.prev);
      p_Var23 = w[-6].done;
      iVar6 = 0;
      goto LAB_001610f2;
    case 0xb:
      s._0_16_ = uv__fs_to_timespec((double)w[-1].wq.next);
      s._16_16_ = uv__fs_to_timespec((double)w[-1].wq.prev);
      iVar6 = futimens(*(int *)&w[-2].wq.next,(timespec *)&s);
      break;
    case 0xc:
      iVar6 = access((char *)w[-6].done,*(int *)((long)&w[-2].wq.next + 4));
      break;
    case 0xd:
      iVar6 = chmod((char *)w[-6].done,*(__mode_t *)&w[-2].wq.prev);
      break;
    case 0xe:
      iVar6 = fchmod(*(int *)&w[-2].wq.next,*(__mode_t *)&w[-2].wq.prev);
      break;
    case 0xf:
      iVar6 = fsync(*(int *)&w[-2].wq.next);
      break;
    case 0x10:
      iVar6 = fdatasync(*(int *)&w[-2].wq.next);
      break;
    case 0x11:
      iVar6 = unlink((char *)w[-6].done);
      break;
    case 0x12:
      iVar6 = rmdir((char *)w[-6].done);
      break;
    case 0x13:
      iVar6 = mkdir((char *)w[-6].done,*(__mode_t *)&w[-2].wq.prev);
      break;
    case 0x14:
      pcVar15 = mkdtemp((char *)w[-6].done);
      puStackY_21b0 = (uv__queue *)-(ulong)(pcVar15 == (char *)0x0);
      goto LAB_0016176e;
    case 0x15:
      iVar6 = rename((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x16:
      auVar4._8_8_ = 0;
      auVar4._0_8_ = s.f_bsize;
      s._0_16_ = auVar4 << 0x40;
      iVar6 = scandir64((char *)w[-6].done,(dirent64 ***)&s,uv__fs_scandir_filter,
                        uv__fs_scandir_sort);
      *(undefined4 *)((long)&w[-2].wq.prev + 4) = 0;
      if (iVar6 != -1) {
        p_Var16 = (_func_void_uv__work_ptr *)s.f_type;
        if (iVar6 == 0) {
          free((void *)s.f_type);
          p_Var16 = (_func_void_uv__work_ptr *)0x0;
        }
        w[-6].work = p_Var16;
        goto LAB_00161865;
      }
LAB_00161850:
      puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
      goto LAB_0016176e;
    case 0x17:
      iVar6 = link((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x18:
      iVar6 = symlink((char *)w[-6].done,(char *)w[-2].loop);
      break;
    case 0x19:
      sVar14 = pathconf((char *)w[-6].done,4);
      sVar29 = 0x1000;
      if (sVar14 != 0xffffffffffffffff) {
        sVar29 = sVar14;
      }
      p_Var16 = (_func_void_uv__work_ptr *)uv__malloc(sVar29);
      if (p_Var16 == (_func_void_uv__work_ptr *)0x0) {
        *puVar11 = 0xc;
      }
      else {
        sVar14 = readlink((char *)w[-6].done,(char *)p_Var16,sVar29);
        if (sVar14 == 0xffffffffffffffff) {
          uv__free(p_Var16);
        }
        else if ((sVar14 != sVar29) ||
                (p_Var16 = (_func_void_uv__work_ptr *)uv__reallocf(p_Var16,sVar29 + 1),
                sVar14 = sVar29, p_Var16 != (_func_void_uv__work_ptr *)0x0)) {
          p_Var16[sVar14] = (_func_void_uv__work_ptr)0x0;
          goto LAB_00161e7c;
        }
      }
      goto LAB_00161778;
    case 0x1a:
      iVar6 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1b:
      iVar6 = fchown(*(int *)&w[-2].wq.next,*(__uid_t *)&w[-1].loop,
                     *(__gid_t *)((long)&w[-1].loop + 4));
      break;
    case 0x1c:
      p_Var16 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
      if (p_Var16 != (_func_void_uv__work_ptr *)0x0) goto LAB_00161e7c;
      goto LAB_00161778;
    case 0x1d:
      uVar8 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&s,(char *)w[-6].done,0,0,(uv_fs_cb)0x0);
      uv_fs_req_cleanup((uv_fs_t *)&s);
      if ((int)uVar8 < 0) {
        puStackY_21b0 = (uv__queue *)(long)(int)uVar8;
      }
      else {
        iVar6 = fstat64(uVar8,(stat64 *)&pfd);
        if (iVar6 == 0) {
          uVar10 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)&s,(char *)w[-2].loop,
                              (*(uint *)((long)&w[-2].wq.next + 4) & 1) << 7 | 0x41,local_20b0,
                              (uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)&s);
          uVar21 = uVar10;
          if (-1 < (int)uVar10) {
            if (((ulong)w[-2].wq.next & 0x100000000) == 0) {
              iVar6 = fstat64(uVar10,&local_2158);
              if (iVar6 == 0) {
                if (((_func_void_uv__work_ptr_int *)
                     CONCAT26(pfd.revents,CONCAT24(pfd.events,pfd.fd)) !=
                     (_func_void_uv__work_ptr_int *)local_2158.st_dev) ||
                   (uVar21 = 0, local_20c0 != local_2158.st_ino)) {
                  iVar6 = ftruncate64(uVar10,0);
                  if ((iVar6 == 0) ||
                     ((uVar13 = (ulong)-*puVar11, *puVar11 == 0xd && (local_2158.st_size < 1))))
                  goto LAB_001619fb;
                  goto LAB_00161d49;
                }
                goto LAB_00161d58;
              }
LAB_00161c94:
              uVar13 = (ulong)-*puVar11;
            }
            else {
LAB_001619fb:
              iVar6 = fchmod(uVar10,local_20b0);
              if (iVar6 != -1) {
LAB_00161a11:
                if (((ulong)w[-2].wq.next & 0x600000000) != 0) {
                  iVar6 = ioctl(uVar10,0x40049409,(ulong)uVar8);
                  uVar21 = 0;
                  if (iVar6 == 0) goto LAB_00161d58;
                  if (((ulong)w[-2].wq.next & 0x400000000) != 0) goto LAB_00161c94;
                }
                lVar28 = 0;
                for (sVar29 = local_2098; uVar21 = 0, sVar29 != 0; sVar29 = sVar29 - uVar13) {
                  uv_fs_sendfile((uv_loop_t *)0x0,(uv_fs_t *)&s,uVar10,uVar8,lVar28,sVar29,
                                 (uv_fs_cb)0x0);
                  uVar13 = s.f_spare[0];
                  uv_fs_req_cleanup((uv_fs_t *)&s);
                  if ((long)uVar13 < 0) goto LAB_00161d49;
                  lVar28 = lVar28 + uVar13;
                }
                goto LAB_00161d58;
              }
              if (*puVar11 == 1) {
                iVar6 = uv__is_cifs_or_smb(uVar10);
                if (iVar6 == 0) {
                  uVar21 = 0xffffffff;
                  goto LAB_00161d58;
                }
                goto LAB_00161a11;
              }
              uVar13 = (ulong)-*puVar11;
            }
LAB_00161d49:
            uVar21 = (uint)uVar13;
            goto LAB_00161d4e;
          }
        }
        else {
          uVar21 = -*puVar11;
          uVar10 = 0xffffffff;
LAB_00161d4e:
          uVar21 = (int)uVar21 >> 0x1f & uVar21;
        }
LAB_00161d58:
        uVar8 = uv__close_nocheckstdio(uVar8);
        if (uVar8 == 0) {
          uVar8 = uVar21;
        }
        if (uVar21 != 0) {
          uVar8 = uVar21;
        }
        if ((int)uVar10 < 0) {
          if (uVar8 == 0) {
LAB_00161dd5:
            puStackY_21b0 = (uv__queue *)0x0;
            goto LAB_0016176e;
          }
        }
        else {
          uVar10 = uv__close_nocheckstdio(uVar10);
          if (uVar10 == 0) {
            uVar10 = uVar8;
          }
          if (uVar8 == 0) {
            uVar8 = uVar10;
          }
          if (uVar8 == 0) goto LAB_00161dd5;
          uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)&s,(char *)w[-2].loop,(uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)&s);
        }
        *puVar11 = -uVar8;
LAB_00161dcc:
        puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
      }
      goto LAB_0016176e;
    case 0x1e:
      iVar6 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4))
      ;
      break;
    case 0x1f:
      p_Var16 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
      if (p_Var16 == (_func_void_uv__work_ptr *)0x0) {
LAB_00161793:
        uv__free(p_Var16);
        puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
        p_Var16 = (_func_void_uv__work_ptr *)0x0;
      }
      else {
        pDVar17 = opendir((char *)w[-6].done);
        *(DIR **)(p_Var16 + 0x30) = pDVar17;
        if (pDVar17 == (DIR *)0x0) goto LAB_00161793;
        puStackY_21b0 = (uv__queue *)0x0;
      }
      w[-6].work = p_Var16;
      goto LAB_0016176e;
    case 0x20:
      p_Var16 = w[-6].work;
      local_2194 = 0;
      while( true ) {
        uVar13 = (ulong)local_2194;
        do {
          if (*(ulong *)(p_Var16 + 8) <= uVar13) goto LAB_00161871;
          *puVar11 = 0;
          dent = readdir64(*(DIR **)(p_Var16 + 0x30));
          if (dent == (dirent64 *)0x0) {
            if (*puVar11 != 0) goto LAB_001617b9;
            goto LAB_00161871;
          }
        } while ((dent->d_name[0] == '.') &&
                ((dent->d_name[1] == '\0' || ((dent->d_name[1] == '.' && (dent->d_name[2] == '\0')))
                 )));
        lVar28 = *(long *)p_Var16;
        pcVar15 = uv__strdup(dent->d_name);
        *(char **)(lVar28 + uVar13 * 0x10) = pcVar15;
        if (pcVar15 == (char *)0x0) break;
        uVar7 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
        *(uv_dirent_type_t *)(lVar28 + uVar13 * 0x10 + 8) = uVar7;
        local_2194 = local_2194 + 1;
      }
LAB_001617b9:
      for (lVar28 = 0; uVar13 << 4 != lVar28; lVar28 = lVar28 + 0x10) {
        uv__free(*(void **)(*(long *)p_Var16 + lVar28));
        *(undefined8 *)(*(long *)p_Var16 + lVar28) = 0;
      }
      local_2194 = 0xffffffff;
LAB_00161871:
      puStackY_21b0 = (uv__queue *)(long)(int)local_2194;
      goto LAB_0016176e;
    case 0x21:
      p_Var16 = w[-6].work;
      if (*(DIR **)(p_Var16 + 0x30) != (DIR *)0x0) {
        closedir(*(DIR **)(p_Var16 + 0x30));
        *(undefined8 *)(p_Var16 + 0x30) = 0;
        p_Var16 = w[-6].work;
      }
      uv__free(p_Var16);
      p_Var16 = (_func_void_uv__work_ptr *)0x0;
LAB_00161e7c:
      w[-6].work = p_Var16;
      w[-7].wq.prev = (uv__queue *)0x0;
      goto LAB_00161e15;
    case 0x22:
      puStackY_21b0 = (uv__queue *)0xffffffffffffffff;
      iVar6 = statfs64((char *)w[-6].done,(statfs64 *)&s);
      if (iVar6 == 0) {
        p_Var16 = (_func_void_uv__work_ptr *)uv__malloc(0x58);
        if (p_Var16 == (_func_void_uv__work_ptr *)0x0) {
          *puVar11 = 0xc;
        }
        else {
          *(__fsword_t *)p_Var16 = s.f_type;
          *(__fsword_t *)(p_Var16 + 8) = s.f_bsize;
          *(__fsblkcnt64_t *)(p_Var16 + 0x10) = s.f_blocks;
          *(__fsblkcnt64_t *)(p_Var16 + 0x18) = s.f_bfree;
          *(__fsblkcnt64_t *)(p_Var16 + 0x20) = s.f_bavail;
          *(__fsfilcnt64_t *)(p_Var16 + 0x28) = s.f_files;
          *(__fsfilcnt64_t *)(p_Var16 + 0x30) = s.f_ffree;
          w[-6].work = p_Var16;
          puStackY_21b0 = (uv__queue *)0x0;
        }
      }
      goto LAB_0016176e;
    case 0x23:
      p_Var23 = w[-6].done;
      sVar18 = strlen((char *)p_Var23);
      if ((sVar18 < 6) || (iVar6 = strcmp((char *)(p_Var23 + (sVar18 - 6)),"XXXXXX"), iVar6 != 0)) {
        *puVar11 = 0x16;
        iVar6 = -1;
      }
      else {
        uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
        if (uv__mkostemp != (_func_int_char_ptr_int *)0x0 && uv__fs_mkstemp_no_cloexec_support == 0)
        {
          iVar6 = (*uv__mkostemp)((char *)p_Var23,0x80000);
          if (-1 < iVar6) goto LAB_00161865;
          if (*puVar11 != 0x16) goto LAB_00161753;
          uv__fs_mkstemp_no_cloexec_support = 1;
        }
        if (w[-7].wq.next != (uv__queue *)0x0) {
          uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
        }
        iVar6 = mkstemp64((char *)p_Var23);
        if ((-1 < iVar6) && (iVar9 = uv__cloexec(iVar6,1), iVar9 != 0)) {
          iVar6 = uv__close(iVar6);
          if (iVar6 != 0) {
switchD_00160df5_default:
            abort();
          }
          iVar6 = -1;
        }
        if (w[-7].wq.next != (uv__queue *)0x0) {
          uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
        }
        if (-1 < iVar6) goto LAB_00161865;
      }
LAB_00161753:
      *p_Var23 = (_func_void_uv__work_ptr_int)0x0;
LAB_00161865:
      puStackY_21b0 = (uv__queue *)(long)iVar6;
      goto LAB_0016176e;
    case 0x24:
      s._0_16_ = uv__fs_to_timespec((double)w[-1].wq.next);
      s._16_16_ = uv__fs_to_timespec((double)w[-1].wq.prev);
      p_Var23 = w[-6].done;
      iVar6 = 0x100;
LAB_001610f2:
      iVar6 = utimensat(-100,(char *)p_Var23,(timespec *)&s,iVar6);
      break;
    default:
      goto switchD_00160df5_default;
    }
    puStackY_21b0 = (uv__queue *)(long)iVar6;
LAB_0016176e:
    if (puStackY_21b0 != (uv__queue *)0xffffffffffffffff) {
      w[-7].wq.prev = puStackY_21b0;
      if (puStackY_21b0 != (uv__queue *)0x0) {
        return;
      }
LAB_00161e15:
      if (2 < *(int *)&w[-7].done - 6U) {
        return;
      }
      w[-6].work = (_func_void_uv__work_ptr *)buf;
      return;
    }
LAB_00161778:
    if ((0xfffffffd < iVar1 - 4U) || (*puVar11 != 4)) {
      w[-7].wq.prev = (uv__queue *)-(long)(int)*puVar11;
      return;
    }
  } while( true );
code_r0x00160fa2:
  if ((puStackY_21b0 != (uv__queue *)0x0) || (!bVar3)) {
    if ((code *)((long)&puStackY_21b0->next + 1U) < (code *)0x2) goto LAB_00161dcc;
LAB_00161c86:
    w[-1].done = local_2190;
    goto LAB_0016176e;
  }
  puStackY_21b0 = (uv__queue *)0x0;
  bVar3 = false;
  if ((uVar8 == 5) || (uVar8 == 0x1d)) goto LAB_00160f49;
  goto LAB_00161850;
LAB_001612ab:
  if (puStackY_21b0 == (uv__queue *)0x0) {
    puStackY_21b0 = (uv__queue *)0x0;
LAB_00161cde:
    if (puVar27 == (uv__queue *)0x0) {
      puVar27 = puStackY_21b0;
    }
    goto joined_r0x00161cef;
  }
  if (-1 < (long)w[-1].done) {
    w[-1].done = w[-1].done + (long)puStackY_21b0;
  }
  p_Var16 = w[-1].work;
  pcVar25 = p_Var16 + 8;
  uVar21 = 0;
  for (puVar26 = puStackY_21b0; puVar26 != (uv__queue *)0x0;
      puVar26 = (uv__queue *)((long)puVar26 - (long)puVar2)) {
    puVar2 = *(uv__queue **)pcVar25;
    if (puVar26 <= puVar2 && (long)puVar2 - (long)puVar26 != 0) {
      *(code **)(pcVar25 + -8) = (code *)((long)&puVar26->next + *(ulong *)(pcVar25 + -8));
      *(long *)pcVar25 = (long)puVar2 - (long)puVar26;
      p_Var16 = w[-1].work;
      break;
    }
    uVar21 = uVar21 + 1;
    pcVar25 = pcVar25 + 0x10;
  }
  *(uint *)((long)&w[-2].wq.prev + 4) = uVar21;
  w[-1].work = p_Var16 + (ulong)uVar21 * 0x10;
  uVar8 = uVar8 - uVar21;
  puVar27 = (uv__queue *)((long)&puStackY_21b0->next + (long)&puVar27->next);
  goto LAB_001611e2;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LUTIME, uv__fs_lutime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}